

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O2

void initialDistanceFieldFactor(void)

{
  char cVar1;
  QDebug *pQVar2;
  long in_FS_OFFSET;
  QDebug local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (initialDistanceFieldFactor()::initialized == '\0') {
    initialDistanceFieldFactor()::initialized = '\x01';
    cVar1 = qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE");
    if (cVar1 != '\0') {
      QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE =
           qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE",(bool *)0x0);
      lcDistanceField();
      if (((byte)lcDistanceField::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
          0) {
        QMessageLogger::debug();
        pQVar2 = QDebug::operator<<(&local_18,"set the QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE:");
        QDebug::operator<<(pQVar2,QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE);
        QDebug::~QDebug(&local_18);
      }
    }
    cVar1 = qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_SCALE");
    if (cVar1 != '\0') {
      QT_DISTANCEFIELD_DEFAULT_SCALE =
           qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_SCALE",(bool *)0x0);
      lcDistanceField();
      if (((byte)lcDistanceField::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
          0) {
        QMessageLogger::debug();
        pQVar2 = QDebug::operator<<(&local_18,"set the QT_DISTANCEFIELD_DEFAULT_SCALE:");
        QDebug::operator<<(pQVar2,QT_DISTANCEFIELD_DEFAULT_SCALE);
        QDebug::~QDebug(&local_18);
      }
    }
    cVar1 = qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_RADIUS");
    if (cVar1 != '\0') {
      QT_DISTANCEFIELD_DEFAULT_RADIUS =
           qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_RADIUS",(bool *)0x0);
      lcDistanceField();
      if (((byte)lcDistanceField::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
          0) {
        QMessageLogger::debug();
        pQVar2 = QDebug::operator<<(&local_18,"set the QT_DISTANCEFIELD_DEFAULT_RADIUS:");
        QDebug::operator<<(pQVar2,QT_DISTANCEFIELD_DEFAULT_RADIUS);
        QDebug::~QDebug(&local_18);
      }
    }
    cVar1 = qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT");
    if (cVar1 != '\0') {
      QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT =
           qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT",(bool *)0x0);
      lcDistanceField();
      if (((byte)lcDistanceField::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
          0) {
        QMessageLogger::debug();
        pQVar2 = QDebug::operator<<(&local_18,"set the QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT:");
        QDebug::operator<<(pQVar2,QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT);
        QDebug::~QDebug(&local_18);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void initialDistanceFieldFactor()
{
    static bool initialized = false;
    if (initialized)
        return;
    initialized = true;

    if (qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE")) {
        QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE = qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE");
        qCDebug(lcDistanceField) << "set the QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE:" << QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE;
    }

    if (qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_SCALE")) {
        QT_DISTANCEFIELD_DEFAULT_SCALE = qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_SCALE");
        qCDebug(lcDistanceField) << "set the QT_DISTANCEFIELD_DEFAULT_SCALE:" << QT_DISTANCEFIELD_DEFAULT_SCALE;
    }
    if (qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_RADIUS")) {
        QT_DISTANCEFIELD_DEFAULT_RADIUS = qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_RADIUS");
        qCDebug(lcDistanceField) << "set the QT_DISTANCEFIELD_DEFAULT_RADIUS:" << QT_DISTANCEFIELD_DEFAULT_RADIUS;
    }
    if (qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT")) {
        QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT = qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT");
        qCDebug(lcDistanceField) << "set the QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT:" << QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT;
    }
}